

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

int Dar_ManRefactor(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *pVVar3;
  Dar_RefPar_t *pDVar4;
  Kit_Graph_t *pGraph;
  int iVar5;
  int iVar6;
  Ref_Man_t *p;
  abctime aVar7;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vResult;
  Aig_Obj_t *pNode;
  abctime aVar8;
  Vec_Ptr_t *pVVar9;
  abctime aVar10;
  Aig_Obj_t *pObjNew;
  int i;
  int iVar11;
  uint i_00;
  uint uVar12;
  
  p = Dar_ManRefStart(pAig,pPars);
  Aig_ManCleanup(pAig);
  Aig_ManFanoutStart(pAig);
  if (p->pPars->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  aVar7 = Abc_Clock();
  pVVar3 = p->vCuts;
  vSupp = Vec_VecEntry(pVVar3,0);
  vResult = Vec_VecEntry(pVVar3,1);
  p->nNodesInit = pAig->nObjs[6] + pAig->nObjs[5];
  pVVar9 = pAig->vObjs;
  iVar6 = pVVar9->nSize;
  iVar11 = iVar6;
  for (i_00 = 0; (int)i_00 < iVar11; i_00 = i_00 + 1) {
    pNode = (Aig_Obj_t *)Vec_PtrEntry(pVVar9,i_00);
    if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
      if ((iVar6 < (int)i_00) ||
         ((((i_00 >> 8 & 1) == 0 && (pAig->Time2Quit != 0)) &&
          (aVar8 = Abc_Clock(), pAig->Time2Quit < aVar8)))) break;
      pVVar3 = p->vCuts;
      for (iVar11 = 0; iVar11 < pVVar3->nSize; iVar11 = iVar11 + 1) {
        pVVar9 = Vec_VecEntry(pVVar3,iVar11);
        pVVar9->nSize = 0;
      }
      aVar8 = Abc_Clock();
      if (((ulong)pNode & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
      }
      uVar12 = *(uint *)&pNode->field_0x1c & 0xffffff;
      if (uVar12 < 0xb) {
        uVar12 = 10;
      }
      iVar11 = Aig_NodeMffcSupp(pAig,pNode,uVar12 - 10,vSupp);
      pDVar4 = p->pPars;
      if (iVar11 < pDVar4->nMffcMin) {
        aVar10 = Abc_Clock();
        p->timeCuts = p->timeCuts + (aVar10 - aVar8);
      }
      else {
        p->nNodesTried = p->nNodesTried + 1;
        iVar5 = pDVar4->nLeafMax;
        if (iVar5 < vSupp->nSize) {
          Aig_ManFindCut(pNode,vSupp,p->vCutNodes,iVar5,0x32);
          iVar11 = Aig_NodeMffcLabelCut(p->pAig,pNode,vSupp);
        }
        else if ((vSupp->nSize < iVar5 + -2) && (pDVar4->fExtend != 0)) {
          iVar5 = Dar_ObjCutLevelAchieved(vSupp,uVar12 - 10);
          if (iVar5 == 0) {
            iVar5 = Aig_NodeMffcExtendCut(pAig,pNode,vSupp,vResult);
            if ((iVar5 != 0) && (iVar5 = Aig_NodeMffcLabelCut(p->pAig,pNode,vSupp), iVar5 != iVar11)
               ) {
              __assert_fail("nNodesSaved2 == nNodesSaved",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                            ,0x22c,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
            }
            if (pDVar4->nLeafMax < vResult->nSize) {
              vResult->nSize = 0;
            }
            else if (0 < vResult->nSize) {
              p->nNodesExten = p->nNodesExten + 1;
            }
          }
          else {
            p->nNodesBelow = p->nNodesBelow + 1;
          }
        }
        aVar10 = Abc_Clock();
        p->timeCuts = p->timeCuts + (aVar10 - aVar8);
        aVar8 = Abc_Clock();
        if (pAig->vLevelR == (Vec_Int_t *)0x0) {
          iVar5 = 1000000000;
        }
        else {
          iVar5 = Aig_ObjRequiredLevel(pAig,pNode);
        }
        Dar_ManRefactorTryCuts(p,pNode,iVar11,iVar5);
        aVar10 = Abc_Clock();
        p->timeEval = p->timeEval + (aVar10 - aVar8);
        iVar11 = p->GainBest;
        if ((iVar11 < 1) && ((iVar11 != 0 || (p->pPars->fUseZeros == 0)))) {
          if (p->pGraphBest != (Kit_Graph_t *)0x0) {
            Kit_GraphFree(p->pGraphBest);
          }
        }
        else {
          iVar1 = pAig->nObjs[5];
          iVar2 = pAig->nObjs[6];
          pGraph = p->pGraphBest;
          pObjNew = Dar_RefactBuildGraph(pAig,p->vLeavesBest,pGraph);
          if (iVar5 < (int)(*(uint *)(((ulong)pObjNew & 0xfffffffffffffffe) + 0x1c) & 0xffffff)) {
            __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                          ,0x24d,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
          }
          Aig_ObjReplace(pAig,pNode,pObjNew,p->pPars->fUpdateLevel);
          if ((iVar2 + iVar1) - (pAig->nObjs[5] + pAig->nObjs[6]) < iVar11) {
            __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                          ,0x252,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
          }
          Kit_GraphFree(pGraph);
          p->nCutsUsed = p->nCutsUsed + 1;
        }
      }
    }
    pVVar9 = pAig->vObjs;
    iVar11 = pVVar9->nSize;
  }
  aVar8 = Abc_Clock();
  p->timeTotal = aVar8 - aVar7;
  p->timeOther = (aVar8 - aVar7) - (p->timeCuts + p->timeEval);
  Aig_ManFanoutStop(pAig);
  if (p->pPars->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  Aig_ManCleanup(pAig);
  Dar_ManRefStop(p);
  iVar6 = Aig_ManCheck(pAig);
  if (iVar6 == 0) {
    puts("Dar_ManRefactor: The network check has failed.");
  }
  return (uint)(iVar6 != 0);
}

Assistant:

int Dar_ManRefactor( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
//    Bar_Progress_t * pProgress;
    Ref_Man_t * p;
    Vec_Ptr_t * vCut, * vCut2;
    Aig_Obj_t * pObj, * pObjNew;
    int nNodesOld, nNodeBefore, nNodeAfter, nNodesSaved, nNodesSaved2;
    int i, Required, nLevelMin;
    abctime clkStart, clk;

    // start the manager
    p = Dar_ManRefStart( pAig, pPars );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );

    // resynthesize each node once
    clkStart = Abc_Clock();
    vCut = Vec_VecEntry( p->vCuts, 0 );
    vCut2 = Vec_VecEntry( p->vCuts, 1 );
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );
//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
            break;
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
        Vec_VecClear( p->vCuts );

//printf( "\nConsidering node %d.\n", pObj->Id );
        // get the bounded MFFC size
clk = Abc_Clock();
        nLevelMin = Abc_MaxInt( 0, Aig_ObjLevel(pObj) - 10 );
        nNodesSaved = Aig_NodeMffcSupp( pAig, pObj, nLevelMin, vCut );
        if ( nNodesSaved < p->pPars->nMffcMin ) // too small to consider
        {
p->timeCuts += Abc_Clock() - clk;
            continue; 
        }
        p->nNodesTried++;
        if ( Vec_PtrSize(vCut) > p->pPars->nLeafMax ) // get one reconv-driven cut
        {
            Aig_ManFindCut( pObj, vCut, p->vCutNodes, p->pPars->nLeafMax, 50 );
            nNodesSaved = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
        }
        else if ( Vec_PtrSize(vCut) < p->pPars->nLeafMax - 2 && p->pPars->fExtend )
        {
            if ( !Dar_ObjCutLevelAchieved(vCut, nLevelMin) )
            {
                if ( Aig_NodeMffcExtendCut( pAig, pObj, vCut, vCut2 ) )
                {
                    nNodesSaved2 = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
                    assert( nNodesSaved2 == nNodesSaved );
                }
                if ( Vec_PtrSize(vCut2) > p->pPars->nLeafMax )
                    Vec_PtrClear(vCut2);
                if ( Vec_PtrSize(vCut2) > 0 )
                {
                    p->nNodesExten++;
//                    printf( "%d(%d) ", Vec_PtrSize(vCut), Vec_PtrSize(vCut2) );
                }
            }
            else
                p->nNodesBelow++;
        }
p->timeCuts += Abc_Clock() - clk;

        // try the cuts
clk = Abc_Clock();
        Required = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ManRefactorTryCuts( p, pObj, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;

        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
            if ( p->pGraphBest )
                Kit_GraphFree( p->pGraphBest );
            continue;
        }
//printf( "\n" );

        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_RefactBuildGraph( pAig, p->vLeavesBest, p->pGraphBest );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        Kit_GraphFree( p->pGraphBest );
        p->nCutsUsed++;
//        break;
    }
p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
    Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStopReverseLevels( pAig );
/*
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) && Aig_ObjRefs(pObj) == 0 )
        {
            printf( "Unreferenced " );
            Aig_ObjPrintVerbose( pObj, 0 );
            printf( "\n" );
        }
*/
    // remove dangling nodes (they should not be here!)
    Aig_ManCleanup( pAig );

    // stop the rewriting manager
    Dar_ManRefStop( p );
//    Aig_ManCheckPhase( pAig );
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Dar_ManRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;

}